

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_tape.cpp
# Opt level: O3

bool has_screen_changes(void)

{
  byte *pbVar1;
  CDeviceSlot *pCVar2;
  long lVar3;
  ulong uVar4;
  
  pCVar2 = CDevice::GetSlot(Device,1);
  pbVar1 = pCVar2->Page->RAM;
  lVar3 = 0;
  do {
    if (pbVar1[lVar3] != '\0') {
      return true;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x1800);
  uVar4 = 0x17ff;
  do {
    if (pbVar1[uVar4 + 1] != '8') {
      return true;
    }
    uVar4 = uVar4 + 1;
  } while (uVar4 != 0x1aff);
  return uVar4 < 0x1aff;
}

Assistant:

static bool has_screen_changes() {
	unsigned char *pscr = (unsigned char*)Device->GetSlot(1)->Page->RAM;

	for (int i=0; i < 0x1800;i++) {
		if (0 != pscr[i]) {
			return true;
		}
	}

	for (int i=0x1800; i < 0x1B00;i++) {
		if (0x38 != pscr[i]) {
			return true;
		}
	}

	return false;
}